

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O1

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
::io_op(io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
        *this,io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
              *other)

{
  undefined8 uVar1;
  error_category *peVar2;
  offset_in_rpc_session_to_subr oVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  undefined4 uVar7;
  
  this->next_layer_ = other->next_layer_;
  this->core_ = other->core_;
  iVar6 = other->start_;
  this->op_ = (handshake_op)(other->op_).type_;
  this->start_ = iVar6;
  this->want_ = other->want_;
  uVar7 = *(undefined4 *)&(other->ec_).field_0x4;
  peVar2 = (other->ec_)._M_cat;
  (this->ec_)._M_value = (other->ec_)._M_value;
  *(undefined4 *)&(this->ec_).field_0x4 = uVar7;
  (this->ec_)._M_cat = peVar2;
  uVar1 = *(undefined8 *)&(other->handler_).field_0x8;
  oVar3 = (other->handler_)._M_f;
  this->bytes_transferred_ = other->bytes_transferred_;
  (this->handler_)._M_f = oVar3;
  *(undefined8 *)&(this->handler_).field_0x8 = uVar1;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->handler_)._M_bound_args.
          super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
          .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
          super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
          super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (other->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
           .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
           super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
           super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(other->handler_)._M_bound_args.
                   super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                   .
                   super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                   .super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
                   super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(other->handler_)._M_bound_args.
          super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
          .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
          super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
          super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->handler_)._M_bound_args.
          super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
          .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
          super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
          super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi = p_Var5;
  (other->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Tuple_impl<1UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Head_base<0UL,_nuraft::rpc_session_*,_false>._M_head_impl =
       (other->handler_)._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_nuraft::rpc_session_*,_false>._M_head_impl;
  return;
}

Assistant:

io_op(io_op&& other)
    : asio::detail::base_from_cancellation_state<Handler>(
        ASIO_MOVE_CAST(
          asio::detail::base_from_cancellation_state<Handler>)(
            other)),
      next_layer_(other.next_layer_),
      core_(other.core_),
      op_(ASIO_MOVE_CAST(Operation)(other.op_)),
      start_(other.start_),
      want_(other.want_),
      ec_(other.ec_),
      bytes_transferred_(other.bytes_transferred_),
      handler_(ASIO_MOVE_CAST(Handler)(other.handler_))
  {
  }